

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinputdevice.h
# Opt level: O0

void __thiscall
UinputDevice::UinputDevice
          (UinputDevice *this,string *path,uint bus,string *name,uint vendor,uint product,
          uint version,
          vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>
          *possibleEvents,
          vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
          *absoluteAxesCalibrationData)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  char *__src;
  reference pAVar5;
  ssize_t sVar6;
  reference pPVar7;
  reference puVar8;
  ostream *poVar9;
  uint local_4f0;
  uint type;
  int code;
  const_iterator __end4;
  const_iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  PossibleEvent *pe;
  const_iterator __end3;
  const_iterator __begin3;
  vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_> *__range3;
  AbsoluteAxisCalibrationData *aacd;
  const_iterator __end2;
  const_iterator __begin2;
  vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  *__range2;
  uinput_user_dev device;
  uint product_local;
  uint vendor_local;
  string *name_local;
  uint bus_local;
  string *path_local;
  UinputDevice *this_local;
  
  this->_fd = 0;
  device.absflat[0x3e] = product;
  device.absflat[0x3f] = vendor;
  open(this,(char *)path,bus);
  if (this->_fd != 0) {
    memset((void *)((long)&__range2 + 4),0,0x45c);
    __src = (char *)std::__cxx11::string::data();
    strncpy((char *)((long)&__range2 + 4),__src,0x50);
    device.name._72_2_ = SUB42(bus,0);
    device.name._76_2_ = SUB42(device.absflat[0x3e],0);
    device.name._74_2_ = SUB42(device.absflat[0x3f],0);
    device.name._78_2_ = SUB42(version,0);
    __end2 = std::
             vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
             ::begin(absoluteAxesCalibrationData);
    aacd = (AbsoluteAxisCalibrationData *)
           std::
           vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
           ::end(absoluteAxesCalibrationData);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_UinputDevice::AbsoluteAxisCalibrationData_*,_std::vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>_>
                                       *)&aacd), bVar3) {
      pAVar5 = __gnu_cxx::
               __normal_iterator<const_UinputDevice::AbsoluteAxisCalibrationData_*,_std::vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>_>
               ::operator*(&__end2);
      device.absmin[(long)pAVar5->axis + -2] = pAVar5->min;
      device.absmax[(long)pAVar5->axis + -2] = pAVar5->max;
      device.absfuzz[(long)pAVar5->axis + -2] = pAVar5->fuzz;
      device.absflat[(long)pAVar5->axis + -2] = pAVar5->flat;
      __gnu_cxx::
      __normal_iterator<const_UinputDevice::AbsoluteAxisCalibrationData_*,_std::vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>_>
      ::operator++(&__end2);
    }
    sVar6 = write(this->_fd,(void *)((long)&__range2 + 4),0x45c);
    if (sVar6 == 0x45c) {
      __end3 = std::
               vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>::
               begin(possibleEvents);
      pe = (PossibleEvent *)
           std::vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>::
           end(possibleEvents);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_UinputDevice::PossibleEvent_*,_std::vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>_>
                                         *)&pe), bVar3) {
        pPVar7 = __gnu_cxx::
                 __normal_iterator<const_UinputDevice::PossibleEvent_*,_std::vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>_>
                 ::operator*(&__end3);
        iVar4 = ioctl(this->_fd,0x40045564,(ulong)pPVar7->type);
        if (iVar4 < 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"ERROR: ioctl error adding event type ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,pPVar7->type);
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&pPVar7->codes);
        _type = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&pPVar7->codes);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                           *)&type), bVar3) {
          puVar8 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&__end4);
          uVar1 = *puVar8;
          local_4f0 = 0;
          uVar2 = pPVar7->type;
          if (uVar2 == 1) {
            local_4f0 = 0x40045565;
          }
          else if (uVar2 == 2) {
            local_4f0 = 0x40045566;
          }
          else if (uVar2 == 3) {
            local_4f0 = 0x40045567;
          }
          else {
            poVar9 = std::operator<<((ostream *)&std::cerr,"ERROR: Unsupported event type ");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,pPVar7->type);
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          }
          if ((local_4f0 != 0) &&
             (iVar4 = ioctl(this->_fd,(ulong)local_4f0,(ulong)uVar1), iVar4 < 0)) {
            poVar9 = std::operator<<((ostream *)&std::cerr,"ERROR: ioctl error adding event code ");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,pPVar7->type);
            poVar9 = std::operator<<(poVar9," ");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar1);
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end4);
        }
        __gnu_cxx::
        __normal_iterator<const_UinputDevice::PossibleEvent_*,_std::vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>_>
        ::operator++(&__end3);
      }
      iVar4 = ioctl(this->_fd,0x5501);
      if (iVar4 < 0) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"ERROR: ioctl error creating device");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      close(this->_fd);
      this->_fd = 0;
    }
  }
  return;
}

Assistant:

UinputDevice::UinputDevice(std::string const& path, unsigned int bus, std::string const& name, unsigned int vendor, unsigned int product, unsigned int version, std::vector<PossibleEvent> const& possibleEvents, std::vector<AbsoluteAxisCalibrationData> const& absoluteAxesCalibrationData)
{
  _fd = 0;
  open(path);
  if(_fd)
  {
    uinput_user_dev device;
    memset(&device,0,sizeof(device));
    strncpy(device.name, name.data(), UINPUT_MAX_NAME_SIZE);
    device.id.bustype = bus;
    device.id.product = product;
    device.id.vendor = vendor;
    device.id.version = version;

    for(AbsoluteAxisCalibrationData const& aacd : absoluteAxesCalibrationData) {
      device.absmin[aacd.axis] = aacd.min;
      device.absmax[aacd.axis] = aacd.max;
      device.absfuzz[aacd.axis] = aacd.fuzz;
      device.absflat[aacd.axis] = aacd.flat;
    }

    if(write(_fd, &device, sizeof(device)) != sizeof(device))
    {
      close(_fd);
      _fd = 0;
    }
    else
    {
      for(PossibleEvent const& pe : possibleEvents)
      {
        if(ioctl(_fd, UI_SET_EVBIT, pe.type) < 0)
        {
          std::cerr << "ERROR: ioctl error adding event type " << pe.type << std::endl;
        }

        for(int code : pe.codes)
        {
          unsigned int type = 0;
          switch(pe.type)
          {
            case EV_KEY: type = UI_SET_KEYBIT; break;
            case EV_REL: type = UI_SET_RELBIT; break;
            case EV_ABS: type = UI_SET_ABSBIT; break;
            default: std:: cerr << "ERROR: Unsupported event type " << pe.type << std::endl;
          }

          if(type && ioctl(_fd, type, code) < 0)
          {
            std::cerr << "ERROR: ioctl error adding event code " << pe.type << " " << code << std::endl;
          }
        }
      }

      if(ioctl(_fd, UI_DEV_CREATE) < 0)
      {
        std::cerr << "ERROR: ioctl error creating device" << std::endl;
      }
    }
  }
}